

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O2

void ShiftBytes(VP8LBitReader *br)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  iVar3 = br->bit_pos_;
  while ((7 < iVar3 && (uVar1 = br->pos_, uVar1 < br->len_))) {
    uVar2 = br->val_;
    br->val_ = uVar2 >> 8;
    br->val_ = (ulong)br->buf_[uVar1] << 0x38 | uVar2 >> 8;
    br->pos_ = uVar1 + 1;
    iVar3 = iVar3 + -8;
    br->bit_pos_ = iVar3;
  }
  iVar3 = VP8LIsEndOfStream(br);
  if (iVar3 != 0) {
    br->bit_pos_ = 0;
    br->eos_ = 1;
  }
  return;
}

Assistant:

static void ShiftBytes(VP8LBitReader* const br) {
  while (br->bit_pos_ >= 8 && br->pos_ < br->len_) {
    br->val_ >>= 8;
    br->val_ |= ((vp8l_val_t)br->buf_[br->pos_]) << (VP8L_LBITS - 8);
    ++br->pos_;
    br->bit_pos_ -= 8;
  }
  if (VP8LIsEndOfStream(br)) {
    VP8LSetEndOfStream(br);
  }
}